

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_object.cc
# Opt level: O3

ASN1_OBJECT * c2i_ASN1_OBJECT(ASN1_OBJECT **a,uchar **pp,long length)

{
  int iVar1;
  ASN1_OBJECT *pAVar2;
  CBS cbs;
  CBS local_38;
  
  if (length < 0) {
    iVar1 = 0x75;
  }
  else {
    local_38.data = *pp;
    local_38.len = length;
    iVar1 = CBS_is_valid_asn1_oid(&local_38);
    if (iVar1 != 0) {
      pAVar2 = ASN1_OBJECT_create(0,*pp,(int)length,(char *)0x0,(char *)0x0);
      if (pAVar2 == (ASN1_OBJECT *)0x0) {
        return (ASN1_OBJECT *)0x0;
      }
      if (a != (ASN1_OBJECT **)0x0) {
        ASN1_OBJECT_free(*a);
        *a = pAVar2;
      }
      *pp = *pp + length;
      return pAVar2;
    }
    iVar1 = 0x7c;
  }
  ERR_put_error(0xc,0,0x92,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_object.cc"
                ,iVar1);
  return (ASN1_OBJECT *)0x0;
}

Assistant:

ASN1_OBJECT *c2i_ASN1_OBJECT(ASN1_OBJECT **out, const unsigned char **inp,
                             long len) {
  if (len < 0) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_INVALID_OBJECT_ENCODING);
    return NULL;
  }

  CBS cbs;
  CBS_init(&cbs, *inp, (size_t)len);
  if (!CBS_is_valid_asn1_oid(&cbs)) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_INVALID_OBJECT_ENCODING);
    return NULL;
  }

  ASN1_OBJECT *ret = ASN1_OBJECT_create(NID_undef, *inp, (size_t)len,
                                        /*sn=*/NULL, /*ln=*/NULL);
  if (ret == NULL) {
    return NULL;
  }

  if (out != NULL) {
    ASN1_OBJECT_free(*out);
    *out = ret;
  }
  *inp += len;  // All bytes were consumed.
  return ret;
}